

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vepu541_common.c
# Opt level: O0

MPP_RET vepu541_set_fmt(VepuFmtCfg *cfg,MppFrameFormat format)

{
  MppFrameFormat MVar1;
  MPP_RET local_24;
  VepuFmtCfg *pVStack_20;
  MPP_RET ret;
  VepuFmtCfg *fmt;
  MppFrameFormat format_local;
  VepuFmtCfg *cfg_local;
  
  pVStack_20 = (VepuFmtCfg *)0x0;
  local_24 = MPP_OK;
  MVar1 = format & 0xfffff;
  if (((format & 0xf0000) == MPP_FMT_YUV420SP) && (MVar1 < MPP_FMT_YUV_BUTT)) {
    pVStack_20 = vepu541_yuv_cfg + MVar1;
  }
  else if (((format & 0xf0000) == MPP_FMT_RGB565) && (MVar1 < MPP_FMT_RGB_BUTT)) {
    pVStack_20 = vepu541_rgb_cfg + (MVar1 - MPP_FMT_RGB565);
  }
  else {
    memset(cfg,0,0x28);
    cfg->format = VEPU541_FMT_NONE;
  }
  if ((pVStack_20 == (VepuFmtCfg *)0x0) || (pVStack_20->format == VEPU541_FMT_NONE)) {
    _mpp_log_l(2,"vepu541_common","unsupport frame format %x\n","vepu541_set_fmt",(ulong)MVar1);
    cfg->format = VEPU541_FMT_NONE;
    local_24 = MPP_NOK;
  }
  else {
    memcpy(cfg,pVStack_20,0x28);
  }
  return local_24;
}

Assistant:

MPP_RET vepu541_set_fmt(VepuFmtCfg *cfg, MppFrameFormat format)
{
    VepuFmtCfg *fmt = NULL;
    MPP_RET ret = MPP_OK;

    format &= MPP_FRAME_FMT_MASK;

    if (MPP_FRAME_FMT_IS_YUV(format)) {
        fmt = &vepu541_yuv_cfg[format - MPP_FRAME_FMT_YUV];
    } else if (MPP_FRAME_FMT_IS_RGB(format)) {
        fmt = &vepu541_rgb_cfg[format - MPP_FRAME_FMT_RGB];
    } else {
        memset(cfg, 0, sizeof(*cfg));
        cfg->format = VEPU541_FMT_NONE;
    }

    if (fmt && fmt->format != VEPU541_FMT_NONE) {
        memcpy(cfg, fmt, sizeof(*cfg));
    } else {
        mpp_err_f("unsupport frame format %x\n", format);
        cfg->format = VEPU541_FMT_NONE;
        ret = MPP_NOK;
    }

    return ret;
}